

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert_number.c
# Opt level: O1

int mpt_convert_number(char *src,int fmt,void *dest)

{
  char cVar1;
  int iVar2;
  ushort **ppuVar3;
  long lVar4;
  
  if (src == (char *)0x0) {
LAB_0010ec42:
    iVar2 = 0;
switchD_0010ec74_caseD_63:
    return iVar2;
  }
  if (fmt == 0x6c) {
    cVar1 = mpt_type_int(8);
    fmt = (int)cVar1;
  }
  else if (fmt == 99) {
    ppuVar3 = __ctype_b_loc();
    lVar4 = 0;
    do {
      cVar1 = src[lVar4];
      lVar4 = lVar4 + 1;
    } while (((*ppuVar3)[cVar1] >> 0xd & 1) != 0);
    if (cVar1 != '\0') {
      if (-1 < (short)(*ppuVar3)[cVar1]) {
        return -3;
      }
      if (dest != (void *)0x0) {
        *(char *)dest = cVar1;
      }
      return (int)lVar4;
    }
    goto LAB_0010ec42;
  }
  iVar2 = -3;
  switch(fmt) {
  case 0x62:
    iVar2 = mpt_cint8((int8_t *)dest,src,0,(int8_t *)0x0);
    return iVar2;
  default:
    goto switchD_0010ec74_caseD_63;
  case 100:
    iVar2 = mpt_cdouble((double *)dest,src,(double *)0x0);
    return iVar2;
  case 0x65:
    iVar2 = mpt_cldouble((longdouble *)dest,src,(longdouble *)0x0);
    return iVar2;
  case 0x66:
    iVar2 = mpt_cfloat((float *)dest,src,(float *)0x0);
    return iVar2;
  case 0x69:
    iVar2 = mpt_cint32((int32_t *)dest,src,0,(int32_t *)0x0);
    return iVar2;
  case 0x6c:
    iVar2 = 0x10;
    break;
  case 0x6e:
    iVar2 = mpt_cint16((int16_t *)dest,src,0,(int16_t *)0x0);
    return iVar2;
  case 0x71:
    iVar2 = mpt_cuint16((uint16_t *)dest,src,0,(uint16_t *)0x0);
    return iVar2;
  case 0x74:
  case 0x78:
    iVar2 = 0;
    break;
  case 0x75:
    iVar2 = mpt_cuint32((uint32_t *)dest,src,0,(uint32_t *)0x0);
    return iVar2;
  case 0x79:
    iVar2 = mpt_cuint8((uint8_t *)dest,src,0,(uint8_t *)0x0);
    return iVar2;
  }
  iVar2 = mpt_cuint64((uint64_t *)dest,src,iVar2,(uint64_t *)0x0);
  return iVar2;
}

Assistant:

extern int mpt_convert_number(const char *src, int fmt, void *dest)
{
	if (!src) {
		return 0;
	}
	if (fmt == 'c') {
		const char *pos = src;
		while (isspace(*pos)) ++pos;
		if (!*pos) return 0;
		if (!isgraph(*pos)) return MPT_ERROR(BadType);
		if (dest) *((char *) dest) = *pos;
		return pos + 1 - src;
	}
	if (fmt == 'l') {
		fmt = mpt_type_int(sizeof(long));
	}
	switch (fmt) {
		case 'b': return mpt_cint8 (dest, src, 0, 0);
		case 'y': return mpt_cuint8(dest, src, 0, 0);
		
		case 'n': return mpt_cint16 (dest, src, 0, 0);
		case 'q': return mpt_cuint16(dest, src, 0, 0);
		
		case 'i': return mpt_cint32 (dest, src, 0, 0);
		case 'u': return mpt_cuint32(dest, src, 0, 0);
		
		case 'x': return mpt_cuint64(dest, src,  0, 0);
		case 't': return mpt_cuint64(dest, src,  0, 0);
		case 'l': return mpt_cuint64(dest, src, 16, 0);
		
		case 'f': return mpt_cfloat(dest, src, 0);
		case 'd': return mpt_cdouble(dest, src, 0);
		case 'e': return mpt_cldouble(dest, src, 0);
		
		default: return MPT_ERROR(BadType);
	}
}